

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRSInterface.cpp
# Opt level: O0

void * RazorAHRSInterfaceThread(void *pParam)

{
  bool bVar1;
  int iVar2;
  BOOL bConnected;
  void *pParam_local;
  
  if ((szRazorAHRSInterfacePath[0] == ':') &&
     (iVar2 = atoi(szRazorAHRSInterfacePath + 1), 0 < iVar2)) {
    RazorAHRSInterfacePseudoRS232Port.DevType = 2;
    do {
      iVar2 = LaunchMultiCliTCPSrv
                        (szRazorAHRSInterfacePath + 1,handlerazorahrsinterfacecli,(void *)0x0);
      if (iVar2 == 0) break;
      printf("Error launching the RazorAHRSInterface server.\n");
      mSleep(4000);
    } while (bExit == 0);
  }
  else {
    bVar1 = false;
    do {
      if (bVar1) {
        iVar2 = handlerazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
        if (iVar2 != 0) {
          printf("Connection to a RazorAHRSInterface lost.\n");
          bVar1 = false;
          disconnectrazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
          uSleep(15000);
        }
      }
      else {
        iVar2 = connectrazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
        if (iVar2 != 0) {
          mSleep(1000);
        }
        else {
          uSleep(15000);
          inithandlerazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
        }
        bVar1 = iVar2 == 0;
      }
    } while (bExit == 0);
    if (bVar1) {
      disconnectrazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
    }
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE RazorAHRSInterfaceThread(void* pParam)
{
	//CHRONO chrono;
	//double dt = 0, t = 0, t0 = 0;
	//struct timeval tv;

	UNREFERENCED_PARAMETER(pParam);

	//EnterCriticalSection(&strtimeCS);
	//sprintf(razorahrsinterfacefilename, LOG_FOLDER"razorahrsinterface_%.64s.txt", strtimeex_fns());
	//LeaveCriticalSection(&strtimeCS);
	//razorahrsinterfacefile = fopen(razorahrsinterfacefilename, "w");
	//if (razorahrsinterfacefile == NULL)
	//{
	//	printf("Unable to create razorahrsinterface file.\n");
	//	if (!bExit) bExit = TRUE; // Unexpected program exit...
	//	return 0;
	//}

	// Try to determine whether it is a server TCP port.
	if ((szRazorAHRSInterfacePath[0] == ':')&&(atoi(szRazorAHRSInterfacePath+1) > 0))
	{
		RazorAHRSInterfacePseudoRS232Port.DevType = TCP_SERVER_TYPE_RS232PORT;
		while (LaunchMultiCliTCPSrv(szRazorAHRSInterfacePath+1, handlerazorahrsinterfacecli, NULL) != EXIT_SUCCESS)
		{
			printf("Error launching the RazorAHRSInterface server.\n");
			mSleep(4000);
			if (bExit) break;
		}
	}
	else
	{
		BOOL bConnected = FALSE;

		//t = 0;

		//StartChrono(&chrono);

		for (;;)
		{
			//uSleep(1000*15);
			//t0 = t;
			//GetTimeElapsedChrono(&chrono, &t);
			//dt = t-t0;

			//printf("RazorAHRSInterfaceThread period : %f s.\n", dt);

			if (!bConnected)
			{
				if (connectrazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port) == EXIT_SUCCESS) 
				{
					uSleep(1000*15);
					bConnected = TRUE; 

					inithandlerazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
				}
				else 
				{
					bConnected = FALSE;
					mSleep(1000);
				}
			}
			else
			{
				//// Time...
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS)
				//{
				//	tv.tv_sec = 0;
				//	tv.tv_usec = 0;
				//}

				if (handlerazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port) != EXIT_SUCCESS)
				{
					printf("Connection to a RazorAHRSInterface lost.\n");
					bConnected = FALSE;
					disconnectrazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
					uSleep(1000*15);
				}
			}

			if (bExit) break;
		}

		//StopChrono(&chrono, &t);

		if (bConnected) disconnectrazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
	}

	//fclose(razorahrsinterfacefile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}